

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testrand_impl.h
# Opt level: O1

uint32_t testrand_int(uint32_t range)

{
  uint uVar1;
  ulong uVar2;
  uint uVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  bool bVar7;
  
  uVar1 = 0;
  uVar3 = range - 1;
  uVar5 = uVar3;
  if (uVar3 != 0) {
    do {
      uVar1 = uVar1 * 2 + 1;
      bVar7 = 1 < uVar5;
      uVar5 = uVar5 >> 1;
    } while (bVar7);
  }
  do {
    uVar5 = ((int)(secp256k1_test_state[3] + secp256k1_test_state[0]) * 0x800000 |
            (uint)(secp256k1_test_state[3] + secp256k1_test_state[0] >> 0x29)) +
            (int)secp256k1_test_state[0] & uVar1;
    uVar6 = secp256k1_test_state[1] << 0x11;
    uVar2 = secp256k1_test_state[2] ^ secp256k1_test_state[0];
    uVar4 = secp256k1_test_state[3] ^ secp256k1_test_state[1];
    secp256k1_test_state[1] = secp256k1_test_state[1] ^ uVar2;
    secp256k1_test_state[0] = secp256k1_test_state[0] ^ uVar4;
    secp256k1_test_state[2] = uVar2 ^ uVar6;
    secp256k1_test_state[3] = uVar4 << 0x2d | uVar4 >> 0x13;
  } while (uVar3 < uVar5);
  return uVar5;
}

Assistant:

static uint32_t testrand_int(uint32_t range) {
    uint32_t mask = 0;
    uint32_t range_copy;
    /* Reduce range by 1, changing its meaning to "maximum value". */
    VERIFY_CHECK(range != 0);
    range -= 1;
    /* Count the number of bits in range. */
    range_copy = range;
    while (range_copy) {
        mask = (mask << 1) | 1U;
        range_copy >>= 1;
    }
    /* Generation loop. */
    while (1) {
        uint32_t val = testrand64() & mask;
        if (val <= range) return val;
    }
}